

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_superblock.c
# Opt level: O0

size_t ZSTD_seqDecompressedSize
                 (seqStore_t *seqStore,seqDef *sequences,size_t nbSeq,size_t litSize,
                 int lastSequence)

{
  ZSTD_sequenceLength ZVar1;
  ZSTD_sequenceLength seqLen;
  size_t litLengthSum;
  size_t matchLengthSum;
  seqDef *sp;
  seqDef *send;
  seqDef *sstart;
  int lastSequence_local;
  size_t litSize_local;
  size_t nbSeq_local;
  seqDef *sequences_local;
  seqStore_t *seqStore_local;
  
  litLengthSum = 0;
  for (matchLengthSum = (size_t)sequences;
      0 < (long)((long)sequences + (nbSeq * 8 - matchLengthSum)) >> 3;
      matchLengthSum = matchLengthSum + 8) {
    ZVar1 = ZSTD_getSequenceLength(seqStore,(seqDef *)matchLengthSum);
    litLengthSum = ((ulong)ZVar1 >> 0x20) + litLengthSum;
  }
  return litLengthSum + litSize;
}

Assistant:

static size_t ZSTD_seqDecompressedSize(seqStore_t const* seqStore, const seqDef* sequences, size_t nbSeq, size_t litSize, int lastSequence) {
    const seqDef* const sstart = sequences;
    const seqDef* const send = sequences + nbSeq;
    const seqDef* sp = sstart;
    size_t matchLengthSum = 0;
    size_t litLengthSum = 0;
    while (send-sp > 0) {
        ZSTD_sequenceLength const seqLen = ZSTD_getSequenceLength(seqStore, sp);
        litLengthSum += seqLen.litLength;
        matchLengthSum += seqLen.matchLength;
        sp++;
    }
    assert(litLengthSum <= litSize);
    if (!lastSequence) {
        assert(litLengthSum == litSize);
    }
    return matchLengthSum + litSize;
}